

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assign_suite::assign_null_with_map(void)

{
  size_type sVar1;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  basic_variable<std::allocator<char>_> *local_290;
  basic_variable<std::allocator<char>_> *local_278;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_258;
  undefined1 local_244;
  undefined1 local_243 [2];
  undefined1 local_241;
  basic_variable<std::allocator<char>_> *local_240;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 auStack_1d8 [32];
  basic_variable<std::allocator<char>_> local_1b8;
  undefined1 local_188 [77];
  undefined1 local_13b;
  undefined1 local_13a [2];
  undefined1 local_138 [8];
  variable data_1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_f8;
  undefined1 local_98 [93];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  sVar1 = 0x9ba;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x9ba,"void assign_suite::assign_null_with_map()",local_3a,&local_3b);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            (&local_f8,(char (*) [6])"alpha",(char (*) [9])"hydrogen");
  local_98._0_8_ = &local_f8;
  local_98._8_8_ = 1;
  init._M_len = sVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10),
             (basic_map<std::allocator<char>_> *)local_98._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  local_258 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_98;
  do {
    local_258 = local_258 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_258);
  } while (local_258 != &local_f8);
  data_1.storage._46_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_map<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_38);
  data_1.storage._45_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x9bc,"void assign_suite::assign_null_with_map()",&data_1.storage.field_0x2e,
             &data_1.storage.field_0x2d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_138);
  local_13a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_138);
  local_13b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x9c0,"void assign_suite::assign_null_with_map()",local_13a,&local_13b);
  local_241 = 1;
  auStack_1d8._24_8_ = &local_1b8;
  local_240 = &local_238;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_240,"alpha");
  local_240 = &local_208;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_240,"hydrogen");
  auStack_1d8._8_8_ = &local_238;
  auStack_1d8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_1b8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_1d8 + 8));
  local_241 = 0;
  local_188._0_8_ = &local_1b8;
  local_188._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_188 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_138,
             (basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  local_278 = (basic_variable<std::allocator<char>_> *)local_188;
  do {
    local_278 = local_278 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_278);
  } while (local_278 != &local_1b8);
  local_290 = (basic_variable<std::allocator<char>_> *)auStack_1d8;
  do {
    local_290 = local_290 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_290);
  } while (local_290 != &local_238);
  local_243[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_138);
  local_244 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x9c2,"void assign_suite::assign_null_with_map()",local_243,&local_244);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_138);
  return;
}

Assistant:

void assign_null_with_map()
{
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data = map::make({{ "alpha", "hydrogen" }});
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data = {{ "alpha", "hydrogen" }};
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
}